

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *this,string_t *s,bool ensure_ascii)

{
  byte byte_00;
  value_type_conflict1 vVar1;
  error_handler_t eVar2;
  uint8_t uVar3;
  char cVar4;
  ulong uVar5;
  byte *pbVar6;
  char *pcVar7;
  size_t sVar8;
  type_error *ptVar9;
  size_type sVar10;
  element_type *peVar11;
  pointer pvVar12;
  value_type_conflict1 *pvVar13;
  reference pvVar14;
  string local_158 [39];
  allocator local_131;
  string local_130 [8];
  string sn_1;
  __cxx11 local_108 [32];
  char local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [55];
  allocator local_71;
  string local_70 [8];
  string sn;
  ulong uStack_48;
  uint8_t byte;
  size_t i;
  size_t undumped_chars;
  size_t bytes_after_last_accept;
  size_t bytes;
  uint local_20;
  uint8_t state;
  uint32_t codepoint;
  bool ensure_ascii_local;
  string_t *s_local;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_local;
  
  bytes._7_1_ = '\0';
  bytes_after_last_accept = 0;
  undumped_chars = 0;
  i = 0;
  uStack_48 = 0;
  state = ensure_ascii;
  _codepoint = s;
  s_local = (string_t *)this;
  do {
    uVar5 = std::__cxx11::string::size();
    if (uVar5 <= uStack_48) {
      if (bytes._7_1_ == '\0') {
        if (bytes_after_last_accept != 0) {
          peVar11 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
          (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,pvVar12,bytes_after_last_accept);
        }
      }
      else {
        eVar2 = this->error_handler;
        if (eVar2 == strict) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,3,'\0',&local_131);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_130);
          sVar8 = std::__cxx11::string::size();
          pbVar6 = (byte *)std::__cxx11::string::back();
          snprintf(pcVar7,sVar8,"%.2X",(ulong)*pbVar6);
          ptVar9 = (type_error *)__cxa_allocate_exception(0x20);
          std::operator+((char *)local_158,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "incomplete UTF-8 string; last byte: 0x");
          type_error::create(ptVar9,0x13c,local_158);
          __cxa_throw(ptVar9,&type_error::typeinfo,type_error::~type_error);
        }
        if (eVar2 == replace) {
          peVar11 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
          (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,pvVar12,undumped_chars);
          if ((state & 1) == 0) {
            peVar11 = std::
                      __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,anon_var_dwarf_19d60,3);
          }
          else {
            peVar11 = std::
                      __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,"\\ufffd",6);
          }
        }
        else {
          if (eVar2 != ignore) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Edward-Elric233[P]LinuxNetworkProgramming/lib/json.hpp"
                          ,0x3ebc,
                          "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) [BasicJsonType = nlohmann::basic_json<>]"
                         );
          }
          peVar11 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
          (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,pvVar12,undumped_chars);
        }
      }
      return;
    }
    pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)_codepoint);
    byte_00 = *pbVar6;
    uVar3 = decode((uint8_t *)((long)&bytes + 7),&local_20,byte_00);
    if (uVar3 == '\0') {
      if (local_20 == 8) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = 'b';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if (local_20 == 9) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = 't';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if (local_20 == 10) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = 'n';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if (local_20 == 0xc) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = 'f';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if (local_20 == 0xd) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = 'r';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if (local_20 == 0x22) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = '\"';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if (local_20 == 0x5c) {
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = '\\';
        pvVar14 = std::array<char,_512UL>::operator[]
                            (&this->string_buffer,bytes_after_last_accept + 1);
        *pvVar14 = '\\';
        bytes_after_last_accept = bytes_after_last_accept + 2;
      }
      else if ((local_20 < 0x20) || (((state & 1) != 0 && (0x7e < local_20)))) {
        if (local_20 < 0x10000) {
          pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
          snprintf(pvVar12 + bytes_after_last_accept,7,"\\u%04x",(ulong)(local_20 & 0xffff));
          bytes_after_last_accept = bytes_after_last_accept + 6;
        }
        else {
          pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
          snprintf(pvVar12 + bytes_after_last_accept,0xd,"\\u%04x\\u%04x",
                   (ulong)((local_20 >> 10) + 0xd7c0 & 0xffff),
                   (ulong)((local_20 & 0x3ff) + 0xdc00 & 0xffff));
          bytes_after_last_accept = bytes_after_last_accept + 0xc;
        }
      }
      else {
        pvVar13 = (value_type_conflict1 *)std::__cxx11::string::operator[]((ulong)_codepoint);
        vVar1 = *pvVar13;
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = vVar1;
        bytes_after_last_accept = bytes_after_last_accept + 1;
      }
      sVar10 = std::array<char,_512UL>::size(&this->string_buffer);
      if (sVar10 - bytes_after_last_accept < 0xd) {
        peVar11 = std::
                  __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
        (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,pvVar12,bytes_after_last_accept);
        bytes_after_last_accept = 0;
      }
      undumped_chars = bytes_after_last_accept;
      i = 0;
    }
    else if (uVar3 == '\x01') {
      if (this->error_handler == strict) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_70,3,'\0',&local_71);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_70);
        sVar8 = std::__cxx11::string::size();
        snprintf(pcVar7,sVar8,"%.2X",(ulong)byte_00);
        ptVar9 = (type_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string(local_108,uStack_48);
        std::operator+(local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )"invalid UTF-8 byte at index ");
        std::operator+(local_c8,local_e8);
        std::operator+(local_a8,local_c8);
        type_error::create(ptVar9,0x13c,local_a8);
        __cxa_throw(ptVar9,&type_error::typeinfo,type_error::~type_error);
      }
      if (1 < this->error_handler - replace) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Edward-Elric233[P]LinuxNetworkProgramming/lib/json.hpp"
                      ,0x3e7d,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump_escaped(const string_t &, const bool) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      if (i != 0) {
        uStack_48 = uStack_48 - 1;
      }
      bytes_after_last_accept = undumped_chars;
      if (this->error_handler == replace) {
        if ((state & 1) == 0) {
          cVar4 = binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
                  ::to_char_type<char,_char,_nullptr>(-0x11);
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars);
          *pvVar14 = cVar4;
          cVar4 = binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
                  ::to_char_type<char,_char,_nullptr>(-0x41);
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 1);
          *pvVar14 = cVar4;
          cVar4 = binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
                  ::to_char_type<char,_char,_nullptr>(-0x43);
          bytes_after_last_accept = undumped_chars + 3;
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 2);
          *pvVar14 = cVar4;
        }
        else {
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars);
          *pvVar14 = '\\';
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 1);
          *pvVar14 = 'u';
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 2);
          *pvVar14 = 'f';
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 3);
          *pvVar14 = 'f';
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 4);
          *pvVar14 = 'f';
          bytes_after_last_accept = undumped_chars + 6;
          pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,undumped_chars + 5);
          *pvVar14 = 'd';
        }
        sVar10 = std::array<char,_512UL>::size(&this->string_buffer);
        if (sVar10 - bytes_after_last_accept < 0xd) {
          peVar11 = std::
                    __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this);
          pvVar12 = std::array<char,_512UL>::data(&this->string_buffer);
          (*peVar11->_vptr_output_adapter_protocol[1])(peVar11,pvVar12,bytes_after_last_accept);
          bytes_after_last_accept = 0;
        }
      }
      i = 0;
      bytes._7_1_ = '\0';
      undumped_chars = bytes_after_last_accept;
    }
    else {
      if ((state & 1) == 0) {
        pvVar13 = (value_type_conflict1 *)std::__cxx11::string::operator[]((ulong)_codepoint);
        vVar1 = *pvVar13;
        pvVar14 = std::array<char,_512UL>::operator[](&this->string_buffer,bytes_after_last_accept);
        *pvVar14 = vVar1;
        bytes_after_last_accept = bytes_after_last_accept + 1;
      }
      i = i + 1;
    }
    uStack_48 = uStack_48 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        std::uint32_t codepoint;
        std::uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        // number of bytes written at the point of the last valid byte
        std::size_t bytes_after_last_accept = 0;
        std::size_t undumped_chars = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) || (ensure_ascii && (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 7, "\\u%04x",
                                                    static_cast<std::uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                    static_cast<std::uint16_t>(0xD7C0u + (codepoint >> 10u)),
                                                    static_cast<std::uint16_t>(0xDC00u + (codepoint & 0x3FFu)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }

                    // remember the byte position of this accept
                    bytes_after_last_accept = bytes;
                    undumped_chars = 0;
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    switch (error_handler)
                    {
                        case error_handler_t::strict:
                        {
                            std::string sn(3, '\0');
                            (std::snprintf)(&sn[0], sn.size(), "%.2X", byte);
                            JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                        }

                        case error_handler_t::ignore:
                        case error_handler_t::replace:
                        {
                            // in case we saw this character the first time, we
                            // would like to read it again, because the byte
                            // may be OK for itself, but just not OK for the
                            // previous sequence
                            if (undumped_chars > 0)
                            {
                                --i;
                            }

                            // reset length buffer to the last accepted index;
                            // thus removing/ignoring the invalid characters
                            bytes = bytes_after_last_accept;

                            if (error_handler == error_handler_t::replace)
                            {
                                // add a replacement character
                                if (ensure_ascii)
                                {
                                    string_buffer[bytes++] = '\\';
                                    string_buffer[bytes++] = 'u';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'd';
                                }
                                else
                                {
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xEF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBD');
                                }

                                // write buffer and reset index; there must be 13 bytes
                                // left, as this is the maximal number of bytes to be
                                // written ("\uxxxx\uxxxx\0") for one code point
                                if (string_buffer.size() - bytes < 13)
                                {
                                    o->write_characters(string_buffer.data(), bytes);
                                    bytes = 0;
                                }

                                bytes_after_last_accept = bytes;
                            }

                            undumped_chars = 0;

                            // continue processing the string
                            state = UTF8_ACCEPT;
                            break;
                        }

                        default:            // LCOV_EXCL_LINE
                            JSON_ASSERT(false);  // LCOV_EXCL_LINE
                    }
                    break;
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (!ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    ++undumped_chars;
                    break;
                }
            }
        }

        // we finished processing the string
        if (JSON_HEDLEY_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            switch (error_handler)
            {
                case error_handler_t::strict:
                {
                    std::string sn(3, '\0');
                    (std::snprintf)(&sn[0], sn.size(), "%.2X", static_cast<std::uint8_t>(s.back()));
                    JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
                }

                case error_handler_t::ignore:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    break;
                }

                case error_handler_t::replace:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    // add a replacement character
                    if (ensure_ascii)
                    {
                        o->write_characters("\\ufffd", 6);
                    }
                    else
                    {
                        o->write_characters("\xEF\xBF\xBD", 3);
                    }
                    break;
                }

                default:            // LCOV_EXCL_LINE
                    JSON_ASSERT(false);  // LCOV_EXCL_LINE
            }
        }
    }